

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

token * __thiscall libchars::commands::find_pval(commands *this,token *position)

{
  bool bVar1;
  commands *local_38;
  commands *local_28;
  token *T;
  token *position_local;
  commands *this_local;
  
  if (this->cmd == (command *)0x0) {
    this_local = (commands *)0x0;
  }
  else {
    if (position == (token *)0x0) {
      local_38 = (commands *)this->t_par;
    }
    else {
      local_38 = (commands *)position->next;
    }
    local_28 = local_38;
    while( true ) {
      bVar1 = false;
      if (local_28 != (commands *)0x0) {
        bVar1 = *(int *)((long)(local_28->super_edit_object).buffer + 0x38) != 3;
      }
      if (!bVar1) break;
      local_28 = *(commands **)((long)(local_28->super_edit_object).buffer + 0x80);
    }
    this_local = local_28;
  }
  return (token *)this_local;
}

Assistant:

token *commands::find_pval(token *position)
    {
        if (cmd == NULL)
            return NULL;

        token *T = (position == NULL) ? t_par : position->next;
        while (T != NULL && T->ttype != token::VALUE)
            T = T->next;

        return T;
    }